

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptor::DebugString
          (OneofDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  Descriptor *this_00;
  FileDescriptor *this_01;
  long in_RCX;
  char *in_RDX;
  int in_ESI;
  OneofDescriptor *in_RDI;
  int i;
  DebugStringOptions *in_stack_00000348;
  string *in_stack_00000350;
  PrintLabelFlag in_stack_00000358;
  int in_stack_0000035c;
  FieldDescriptor *in_stack_00000360;
  SourceLocationCommentPrinter comment_printer;
  string prefix;
  string *in_stack_fffffffffffffaa8;
  string *value;
  SubstituteArg *in_stack_fffffffffffffab0;
  SourceLocationCommentPrinter *this_02;
  DebugStringOptions *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  string *in_stack_fffffffffffffb18;
  SourceLocationCommentPrinter *in_stack_fffffffffffffb20;
  SubstituteArg local_4b8;
  SubstituteArg local_488;
  SubstituteArg local_458;
  SubstituteArg local_428;
  undefined1 local_3f8 [96];
  SubstituteArg local_398;
  SubstituteArg local_368;
  SubstituteArg local_338 [2];
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  int index;
  SubstituteArg *in_stack_fffffffffffffd30;
  SubstituteArg *in_stack_fffffffffffffd38;
  SubstituteArg *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  DescriptorPool *in_stack_fffffffffffffd50;
  Message *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  SubstituteArg *in_stack_fffffffffffffd68;
  SubstituteArg *in_stack_fffffffffffffd70;
  SubstituteArg *in_stack_fffffffffffffd78;
  SubstituteArg *in_stack_fffffffffffffd80;
  SubstituteArg *in_stack_fffffffffffffd88;
  SubstituteArg local_270;
  SubstituteArg local_240;
  undefined1 local_210 [96];
  SubstituteArg local_1b0;
  SubstituteArg local_180 [6];
  allocator local_41;
  string local_40 [32];
  long local_20;
  char *local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(long)(in_ESI * 2),' ',&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_c = local_c + 1;
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::OneofDescriptor>
            ((SourceLocationCommentPrinter *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (OneofDescriptor *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
             in_stack_fffffffffffffad8);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  name_abi_cxx11_(in_RDI);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  strings::internal::SubstituteArg::SubstituteArg(local_180);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_210 + 0x30));
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_210);
  strings::internal::SubstituteArg::SubstituteArg(&local_240);
  strings::internal::SubstituteArg::SubstituteArg(&local_270);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffd60);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffd30);
  this_02 = (SourceLocationCommentPrinter *)local_210;
  value = (string *)(local_210 + 0x30);
  strings::SubstituteAndAppend
            ((string *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (SubstituteArg *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (SubstituteArg *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
  options(in_RDI);
  this_00 = containing_type(in_RDI);
  this_01 = Descriptor::file(this_00);
  FileDescriptor::pool(this_01);
  anon_unknown_1::FormatLineOptions
            (in_stack_fffffffffffffd64,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48);
  if ((*(byte *)(local_20 + 2) & 1) == 0) {
    std::__cxx11::string::append(local_18);
    in_stack_fffffffffffffaf0 = 0;
    while( true ) {
      index = in_stack_fffffffffffffaf0;
      in_stack_fffffffffffffaf4 = field_count(in_RDI);
      if (in_stack_fffffffffffffaf4 <= in_stack_fffffffffffffaf0) break;
      in_stack_fffffffffffffae8 = (string *)field(in_RDI,index);
      FieldDescriptor::DebugString
                (in_stack_00000360,in_stack_0000035c,in_stack_00000358,in_stack_00000350,
                 in_stack_00000348);
      in_stack_fffffffffffffaf0 = index + 1;
    }
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_02,value);
    strings::internal::SubstituteArg::SubstituteArg(local_338);
    strings::internal::SubstituteArg::SubstituteArg(&local_368);
    strings::internal::SubstituteArg::SubstituteArg(&local_398);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_3f8 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_3f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_428);
    strings::internal::SubstituteArg::SubstituteArg(&local_458);
    strings::internal::SubstituteArg::SubstituteArg(&local_488);
    strings::internal::SubstituteArg::SubstituteArg(&local_4b8);
    this_02 = (SourceLocationCommentPrinter *)local_3f8;
    strings::SubstituteAndAppend
              ((string *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
               (SubstituteArg *)CONCAT44(index,in_stack_fffffffffffffd28),
               (SubstituteArg *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
  }
  else {
    std::__cxx11::string::append(local_18);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),in_stack_fffffffffffffae8
            );
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(this_02);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void OneofDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;
  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);
  strings::SubstituteAndAppend(contents, "$0oneof $1 {", prefix, name());

  FormatLineOptions(depth, options(), containing_type()->file()->pool(),
                    contents);

  if (debug_string_options.elide_oneof_body) {
    contents->append(" ... }\n");
  } else {
    contents->append("\n");
    for (int i = 0; i < field_count(); i++) {
      field(i)->DebugString(depth, FieldDescriptor::OMIT_LABEL, contents,
                            debug_string_options);
    }
    strings::SubstituteAndAppend(contents, "$0}\n", prefix);
  }
  comment_printer.AddPostComment(contents);
}